

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_parser.c
# Opt level: O1

HT_ErrorCode set_global_timeline_buffer_size(int argc,char **argv,int pos)

{
  char *__nptr;
  HT_ErrorCode HVar1;
  int *piVar2;
  ulong buffer_size;
  char *end;
  char *local_18;
  
  HVar1 = HT_ERR_MISSING_ARGUMENT;
  if (pos + 1 < argc) {
    local_18 = (char *)0xd;
    __nptr = argv[pos + 1];
    piVar2 = __errno_location();
    *piVar2 = 0;
    buffer_size = strtoul(__nptr,&local_18,10);
    HVar1 = HT_ERR_OUT_OF_RANGE;
    if ((*piVar2 != 0x22) && (HVar1 = HT_ERR_INVALID_FORMAT, local_18 != __nptr)) {
      ht_global_timeline_set_buffer_size(buffer_size);
      HVar1 = HT_ERR_OK;
    }
  }
  return HVar1;
}

Assistant:

static HT_ErrorCode
set_global_timeline_buffer_size(int argc, char** argv, int pos)
{
    if (pos + 1 >= argc)
    {
        return HT_ERR_MISSING_ARGUMENT;
    }

    const char* s = argv[pos + 1];
    char* end;
    errno = 0;
    unsigned long value = strtoul(s, &end, 10);

    if (errno == ERANGE ||
        (sizeof(size_t) < sizeof(unsigned long) && (unsigned long)HT_SIZE_MAX < value))
    {
        return HT_ERR_OUT_OF_RANGE;
    }

    if (end - s == 0)
    {
        return HT_ERR_INVALID_FORMAT;
    }

    ht_global_timeline_set_buffer_size((size_t) value);
    return HT_ERR_OK;
}